

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_msh2(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  uint uVar2;
  REF_INT RVar3;
  REF_INT RVar4;
  REF_INT RVar5;
  REF_INT RVar6;
  REF_STATUS RVar7;
  FILE *__stream;
  void *__ptr;
  void *__ptr_00;
  REF_INT n3_3;
  REF_INT n2_4;
  REF_INT n1_4;
  REF_INT n0_4;
  REF_INT n9_1;
  REF_INT n8;
  REF_INT n7;
  REF_INT n6;
  REF_INT n5_1;
  REF_INT n4_2;
  REF_INT n3_2;
  REF_INT n2_3;
  REF_INT n1_3;
  REF_INT n0_3;
  REF_INT n5;
  REF_INT n4_1;
  REF_INT n3_1;
  REF_INT n2_2;
  REF_INT n1_2;
  REF_INT n0_2;
  REF_INT n2_1;
  REF_INT n1_1;
  REF_INT n0_1;
  REF_INT n9;
  REF_INT n4;
  REF_INT n3;
  REF_INT n2;
  REF_INT n1;
  REF_INT n0;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  int datasize;
  int filetype;
  double version;
  uint local_d8;
  REF_INT cell_node;
  REF_INT nodes [27];
  int local_64;
  REF_CELL pRStack_60;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT ntag;
  REF_INT type;
  REF_INT ncell;
  REF_INT group;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_INT nnode;
  REF_INT node;
  REF_NODE ref_node;
  FILE *f;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x950,
           "ref_export_msh2","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"$MeshFormat\n%3.1f %d %d\n$EndMeshFormat\n",0x400199999999999a,0,8);
    if (pRVar1->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x955,"ref_export_msh2","malloc o2n of REF_INT negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      __ptr = malloc((long)pRVar1->max << 2);
      if (__ptr == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x955,"ref_export_msh2","malloc o2n of REF_INT NULL");
        ref_grid_local._4_4_ = 2;
      }
      else {
        for (n0 = 0; n0 < pRVar1->max; n0 = n0 + 1) {
          *(undefined4 *)((long)__ptr + (long)n0 * 4) = 0xffffffff;
        }
        if (pRVar1->max < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x956,"ref_export_msh2","malloc n2o of REF_INT negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          __ptr_00 = malloc((long)pRVar1->max << 2);
          if (__ptr_00 == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x956,"ref_export_msh2","malloc n2o of REF_INT NULL");
            ref_grid_local._4_4_ = 2;
          }
          else {
            for (n1 = 0; n1 < pRVar1->max; n1 = n1 + 1) {
              *(undefined4 *)((long)__ptr_00 + (long)n1 * 4) = 0xffffffff;
            }
            o2n._0_4_ = 0;
            for (o2n._4_4_ = 0; o2n._4_4_ < pRVar1->max; o2n._4_4_ = o2n._4_4_ + 1) {
              if (((-1 < o2n._4_4_) && (o2n._4_4_ < pRVar1->max)) &&
                 (-1 < pRVar1->global[o2n._4_4_])) {
                *(uint *)((long)__ptr + (long)o2n._4_4_ * 4) = (uint)o2n;
                *(int *)((long)__ptr_00 + (long)(int)(uint)o2n * 4) = o2n._4_4_;
                o2n._0_4_ = (uint)o2n + 1;
              }
            }
            fprintf(__stream,"$Nodes\n%d\n",(ulong)(uint)o2n);
            for (o2n._4_4_ = 0; o2n._4_4_ < (int)(uint)o2n; o2n._4_4_ = o2n._4_4_ + 1) {
              fprintf(__stream,"%d %.16E %.16E %.16E\n",
                      pRVar1->real[*(int *)((long)__ptr_00 + (long)o2n._4_4_ * 4) * 0xf],
                      pRVar1->real[*(int *)((long)__ptr_00 + (long)o2n._4_4_ * 4) * 0xf + 1],
                      pRVar1->real[*(int *)((long)__ptr_00 + (long)o2n._4_4_ * 4) * 0xf + 2],
                      (ulong)(o2n._4_4_ + 1));
            }
            fprintf(__stream,"$EndNodes\n");
            ntag = 0;
            type = 0;
            pRStack_60 = ref_grid->cell[0];
            while (type < 0x10) {
              if (0 < pRStack_60->n) {
                ntag = pRStack_60->n + ntag;
              }
              type = type + 1;
              pRStack_60 = ref_grid->cell[type];
            }
            fprintf(__stream,"$Elements\n%d\n",(ulong)(uint)ntag);
            ntag = 0;
            type = 0;
            pRStack_60 = ref_grid->cell[0];
            while (type < 0x10) {
              if (0 < pRStack_60->n) {
                ref_cell._4_4_ = 0xffffffff;
                switch(pRStack_60->type) {
                case REF_CELL_EDG:
                  ref_cell._4_4_ = 1;
                  break;
                case REF_CELL_ED2:
                  ref_cell._4_4_ = 8;
                  break;
                case REF_CELL_ED3:
                  ref_cell._4_4_ = 0x1a;
                  break;
                case REF_CELL_TRI:
                  ref_cell._4_4_ = 2;
                  break;
                case REF_CELL_TR2:
                  ref_cell._4_4_ = 9;
                  break;
                case REF_CELL_TR3:
                  ref_cell._4_4_ = 0x15;
                  break;
                case REF_CELL_QUA:
                  ref_cell._4_4_ = 3;
                  break;
                case REF_CELL_QU2:
                case REF_CELL_PY2:
                case REF_CELL_PR2:
                case REF_CELL_HE2:
                  return 6;
                case REF_CELL_TET:
                  ref_cell._4_4_ = 4;
                  break;
                case REF_CELL_PYR:
                  ref_cell._4_4_ = 7;
                  break;
                case REF_CELL_PRI:
                  ref_cell._4_4_ = 6;
                  break;
                case REF_CELL_HEX:
                  ref_cell._4_4_ = 5;
                  break;
                case REF_CELL_TE2:
                  ref_cell._4_4_ = 0xb;
                }
                for (local_64 = 0; local_64 < pRStack_60->max; local_64 = local_64 + 1) {
                  RVar7 = ref_cell_nodes(pRStack_60,local_64,(REF_INT *)&local_d8);
                  RVar5 = nodes[7];
                  RVar6 = nodes[5];
                  RVar4 = nodes[2];
                  RVar3 = nodes[1];
                  uVar2 = local_d8;
                  if (RVar7 == 0) {
                    if (pRStack_60->type == REF_CELL_PYR) {
                      nodes[1] = cell_node;
                      nodes[2] = nodes[0];
                      cell_node = RVar3;
                      nodes[0] = RVar4;
                    }
                    RVar4 = nodes[1];
                    RVar3 = cell_node;
                    if (pRStack_60->type == REF_CELL_TE2) {
                      nodes[7] = nodes[6];
                      nodes[6] = RVar5;
                    }
                    if (pRStack_60->type == REF_CELL_TRI) {
                      local_d8 = nodes[0];
                      nodes[0] = uVar2;
                    }
                    uVar2 = local_d8;
                    if (pRStack_60->type == REF_CELL_TR2) {
                      local_d8 = nodes[0];
                      nodes[0] = uVar2;
                      nodes[1] = nodes[2];
                      nodes[2] = RVar4;
                    }
                    RVar5 = nodes[2];
                    RVar4 = nodes[1];
                    uVar2 = local_d8;
                    if (pRStack_60->type == REF_CELL_TR2) {
                      local_d8 = nodes[0];
                      nodes[0] = uVar2;
                      nodes[1] = nodes[4];
                      nodes[2] = nodes[3];
                      nodes[3] = RVar4;
                      nodes[4] = RVar5;
                      nodes[5] = nodes[6];
                      nodes[6] = RVar6;
                    }
                    uVar2 = local_d8;
                    if (pRStack_60->type == REF_CELL_QUA) {
                      local_d8 = nodes[1];
                      cell_node = nodes[0];
                      nodes[0] = RVar3;
                      nodes[1] = uVar2;
                    }
                    fprintf(__stream,"%d %d %d",(ulong)(ntag + 1),(ulong)ref_cell._4_4_,2);
                    if (pRStack_60->last_node_is_an_id == 0) {
                      fprintf(__stream," %d %d",0);
                    }
                    else {
                      fprintf(__stream," %d %d",(ulong)(&local_d8)[pRStack_60->node_per],
                              (ulong)(&local_d8)[pRStack_60->node_per]);
                    }
                    for (version._4_4_ = 0; version._4_4_ < pRStack_60->node_per;
                        version._4_4_ = version._4_4_ + 1) {
                      fprintf(__stream," %d",(ulong)((&local_d8)[version._4_4_] + 1));
                    }
                    fprintf(__stream,"\n");
                    ntag = ntag + 1;
                  }
                }
              }
              type = type + 1;
              pRStack_60 = ref_grid->cell[type];
            }
            fprintf(__stream,"$EndElements\n");
            if (__ptr_00 != (void *)0x0) {
              free(__ptr_00);
            }
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            fclose(__stream);
            ref_grid_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_msh2(REF_GRID ref_grid,
                                          const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, nnode;
  REF_INT *o2n, *n2o;
  REF_INT group;
  REF_INT ncell;
  REF_INT type, ntag;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell_node;

  double version = 2.2;
  int filetype =
      0; /* file-type(ASCII int; 0 for ASCII mode, 1 for binary mode) */
  int datasize = 8; /* data-size(ASCII int; sizeof(size_t)) */

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "$MeshFormat\n%3.1f %d %d\n$EndMeshFormat\n", version, filetype,
          datasize);

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    n2o[nnode] = node;
    nnode++;
  }
  fprintf(f, "$Nodes\n%d\n", nnode);
  for (node = 0; node < nnode; node++) {
    fprintf(f, "%d %.16E %.16E %.16E\n", node + 1,
            ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));
  }
  fprintf(f, "$EndNodes\n");

  ncell = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (0 < ref_cell_n(ref_cell)) {
      ncell += ref_cell_n(ref_cell);
    }
  }

  fprintf(f, "$Elements\n%d\n", ncell);
  ncell = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (0 < ref_cell_n(ref_cell)) {
      type = REF_EMPTY;
      switch (ref_cell_type(ref_cell)) {
        case REF_CELL_EDG:
          type = 1;
          break;
        case REF_CELL_ED2:
          type = 8;
          break;
        case REF_CELL_ED3:
          type = 26;
          break;
        case REF_CELL_TRI:
          type = 2;
          break;
        case REF_CELL_TR2:
          type = 9;
          break;
        case REF_CELL_TR3:
          type = 21;
          break;
        case REF_CELL_QUA:
          type = 3;
          break;
        case REF_CELL_TET:
          type = 4;
          break;
        case REF_CELL_TE2:
          type = 11;
          break;
        case REF_CELL_PYR:
          type = 7;
          break;
        case REF_CELL_PRI:
          type = 6;
          break;
        case REF_CELL_HEX:
          type = 5;
          break;
        case REF_CELL_QU2:
        case REF_CELL_PY2:
        case REF_CELL_PR2:
        case REF_CELL_HE2:
          return REF_IMPLEMENT;
      }
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (REF_CELL_PYR == ref_cell_type(ref_cell)) { /* on side */
          REF_INT n0, n1, n2, n3, n4;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          nodes[0] = n0;
          nodes[3] = n1;
          nodes[4] = n2;
          nodes[1] = n3;
          nodes[2] = n4;
        }
        if (REF_CELL_TE2 == ref_cell_type(ref_cell)) { /* swap 8-9 */
          REF_INT n9;
          n9 = nodes[9];
          nodes[9] = nodes[8];
          nodes[8] = n9;
        }
        if (REF_CELL_TRI == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
        }
        if (REF_CELL_TR2 == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3, n4, n5;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          n5 = nodes[5];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
          nodes[3] = n4;
          nodes[4] = n3;
          nodes[5] = n5;
        }
        if (REF_CELL_TR2 == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3, n4, n5, n6, n7, n8, n9;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          n5 = nodes[5];
          n6 = nodes[6];
          n7 = nodes[7];
          n8 = nodes[8];
          n9 = nodes[9];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
          nodes[3] = n6;
          nodes[4] = n5;
          nodes[5] = n3;
          nodes[6] = n4;
          nodes[7] = n8;
          nodes[8] = n7;
          nodes[9] = n9;
        }
        if (REF_CELL_QUA == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          nodes[0] = n3;
          nodes[1] = n2;
          nodes[2] = n1;
          nodes[3] = n0;
        }
        ntag = 2;
        fprintf(f, "%d %d %d", ncell + 1, type, ntag);
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          fprintf(f, " %d %d", nodes[ref_cell_id_index(ref_cell)],
                  nodes[ref_cell_id_index(ref_cell)]);
        } else {
          fprintf(f, " %d %d", 0, 0);
        }
        each_ref_cell_cell_node(ref_cell, cell_node) {
          fprintf(f, " %d", nodes[cell_node] + 1);
        }
        fprintf(f, "\n");
        ncell++;
      }
    }
  }
  fprintf(f, "$EndElements\n");

  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}